

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O1

bool __thiscall
ON_NurbsSurface::TensorProduct
          (ON_NurbsSurface *this,ON_NurbsCurve *nurbscurveA,ON_NurbsCurve *nurbscurveB,
          ON_TensorProduct *tensor)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int dim;
  int iVar5;
  int cv_count1;
  int iVar6;
  int iVar7;
  int iVar8;
  double *pdVar9;
  double *pdVar10;
  char *sFormat;
  uint uVar11;
  double *pdVar12;
  double dVar13;
  double dVar14;
  
  ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
  iVar3 = (*(nurbscurveA->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])
                    (nurbscurveA);
  iVar4 = (*(nurbscurveB->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])
                    (nurbscurveB);
  dim = (*tensor->_vptr_ON_TensorProduct[4])(tensor);
  iVar5 = (*tensor->_vptr_ON_TensorProduct[2])(tensor);
  if (iVar3 < iVar5) {
    sFormat = "ON_NurbsSurface::TensorProduct() - tensor.DimensionA() > dimA";
    iVar3 = 0xaeb;
  }
  else {
    iVar5 = (*tensor->_vptr_ON_TensorProduct[3])(tensor);
    if (iVar5 <= iVar4) {
      bVar1 = ON_NurbsCurve::IsRational(nurbscurveA);
      bVar2 = ON_NurbsCurve::IsRational(nurbscurveB);
      iVar5 = ON_NurbsCurve::CVCount(nurbscurveA);
      cv_count1 = ON_NurbsCurve::CVCount(nurbscurveB);
      iVar6 = ON_NurbsCurve::Order(nurbscurveA);
      iVar7 = ON_NurbsCurve::Order(nurbscurveB);
      Create(this,dim,bVar1 || bVar2,iVar6,iVar7,iVar5,cv_count1);
      pdVar9 = this->m_knot[0];
      pdVar12 = nurbscurveA->m_knot;
      if (pdVar9 != pdVar12) {
        iVar6 = ON_KnotCount(this->m_order[0],this->m_cv_count[0]);
        memcpy(pdVar9,pdVar12,(long)iVar6 << 3);
      }
      pdVar9 = this->m_knot[1];
      pdVar12 = nurbscurveB->m_knot;
      if (pdVar9 != pdVar12) {
        iVar6 = ON_KnotCount(this->m_order[1],this->m_cv_count[1]);
        memcpy(pdVar9,pdVar12,(long)iVar6 << 3);
      }
      if (iVar5 < 1) {
        return true;
      }
      iVar6 = 0;
      do {
        pdVar9 = ON_NurbsCurve::CV(nurbscurveA,iVar6);
        if (0 < cv_count1) {
          iVar7 = 0;
          do {
            pdVar10 = ON_NurbsCurve::CV(nurbscurveB,iVar7);
            uVar11 = this->m_cv_stride[1] * iVar7 + this->m_cv_stride[0] * iVar6;
            pdVar12 = this->m_cv + uVar11;
            if ((int)uVar11 < 0) {
              pdVar12 = (double *)0x0;
            }
            if (this->m_cv == (double *)0x0) {
              pdVar12 = (double *)0x0;
            }
            dVar13 = 1.0;
            if (bVar1) {
              dVar13 = pdVar9[iVar3];
            }
            dVar14 = 1.0;
            if (bVar2) {
              dVar14 = pdVar10[iVar4];
            }
            iVar8 = (*tensor->_vptr_ON_TensorProduct[5])
                              (~-(ulong)(dVar13 == 0.0) & (ulong)(1.0 / dVar13),
                               ~-(ulong)(dVar14 == 0.0) & (ulong)(1.0 / dVar14),tensor,pdVar9,
                               pdVar10,pdVar12);
            if ((char)iVar8 == '\0') {
              return false;
            }
            if (bVar1 || bVar2) {
              pdVar10 = pdVar12;
              iVar8 = dim;
              if (0 < dim) {
                do {
                  pdVar12 = pdVar10 + 1;
                  *pdVar10 = *pdVar10 * dVar13 * dVar14;
                  iVar8 = iVar8 + -1;
                  pdVar10 = pdVar12;
                } while (iVar8 != 0);
              }
              *pdVar12 = dVar13 * dVar14;
            }
            iVar7 = iVar7 + 1;
          } while (iVar7 != cv_count1);
        }
        iVar6 = iVar6 + 1;
        if (iVar6 == iVar5) {
          return true;
        }
      } while( true );
    }
    sFormat = "ON_NurbsSurface::TensorProduct() - tensor.DimensionB() > dimB";
    iVar3 = 0xaef;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_nurbssurface.cpp"
             ,iVar3,"",sFormat);
  return false;
}

Assistant:

bool ON_NurbsSurface::TensorProduct(
      const ON_NurbsCurve& nurbscurveA,
      const ON_NurbsCurve& nurbscurveB,
      ON_TensorProduct& tensor
      )
{
  DestroySurfaceTree();
  //   The resulting surface will satisfy
  // 	 NurbSrf(s,t) = T( NurbA(s), NurbB(t) )
  // 
  //   If you want to understand the relationship between multilinear maps
  //   and tensor products, read chapter 16 of Serge Lang's Algebra book.
  //   The connection between Lang and tensor product nurb surfaces being
  //   that NurbA and NurbB are elements of the module of piecewise polynomial
  //   functions that satisfy certain degree and continuity constraints.

  bool rc;
	double wA, wB, wC;
	const double *cvA, *cvB;
	double *cvC;
	int i, j, k,  cv_countA, cv_countB, dimA, dimB, dimC, is_ratA, is_ratB, is_ratC;

	dimA = nurbscurveA.Dimension();
	dimB = nurbscurveB.Dimension();
	dimC = tensor.DimensionC();

  if ( tensor.DimensionA() > dimA ) {
    ON_ERROR("ON_NurbsSurface::TensorProduct() - tensor.DimensionA() > dimA");
    return false;
  }
  if ( tensor.DimensionB() > dimB ) {
    ON_ERROR("ON_NurbsSurface::TensorProduct() - tensor.DimensionB() > dimB");
    return false;
  }

	is_ratA = nurbscurveA.IsRational();
	is_ratB = nurbscurveB.IsRational();
	is_ratC = (is_ratA || is_ratB);
  cv_countA = nurbscurveA.CVCount();
  cv_countB = nurbscurveB.CVCount();

  Create( dimC, is_ratC, nurbscurveA.Order(), nurbscurveB.Order(), cv_countA, cv_countB );

  if ( m_knot[0] != nurbscurveA.m_knot )
    memcpy( m_knot[0], nurbscurveA.m_knot, KnotCount(0)*sizeof(*m_knot[0]) );
  if ( m_knot[1] != nurbscurveB.m_knot )
    memcpy( m_knot[1], nurbscurveB.m_knot, KnotCount(1)*sizeof(*m_knot[1]) );

	for (i = 0; i < cv_countA; i++) {
    cvA = nurbscurveA.CV(i);
		for (j = 0; j < cv_countB; j++) {
  		cvB = nurbscurveB.CV(j);
      cvC = CV(i,j);
			wA = (is_ratA) ? cvA[dimA] : 1.0;
			wB = (is_ratB) ? cvB[dimB] : 1.0;
			rc = tensor.Evaluate( (wA == 0.0) ? 0.0 : 1.0/wA, cvA, 
									          (wB == 0.0) ? 0.0 : 1.0/wB, cvB, 
									          cvC );
      if ( !rc )
        return false;
			if (is_ratC) {
  			wC = wA*wB;
        for ( k = 0; k < dimC; k++ )
          *cvC++ *= wC;
        *cvC = wC;
			}
		}
	}
	return true;
}